

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

SceneSignal __thiscall StateScene::process(StateScene *this,int state)

{
  int iVar1;
  SceneSignal SVar2;
  int iVar3;
  reference pvVar4;
  int tIdx;
  int state_local;
  StateScene *this_local;
  SceneSignal signal;
  
  SceneSignal::SceneSignal((SceneSignal *)&this_local,0,0);
  this->state = state;
  if (state != 0) {
    if (state == 1) {
      iVar3 = this->startIndex + this->selectIndex;
      pvVar4 = std::vector<PlantInfo,_std::allocator<PlantInfo>_>::operator[]
                         (&this->infos,(long)iVar3);
      if ((pvVar4->count == 0) &&
         (iVar1 = this->sunsNumber,
         pvVar4 = std::vector<PlantInfo,_std::allocator<PlantInfo>_>::operator[]
                            (&this->infos,(long)iVar3), pvVar4->needSunNumber <= iVar1)) {
        this_local._0_4_ = 1;
        pvVar4 = std::vector<PlantInfo,_std::allocator<PlantInfo>_>::operator[]
                           (&this->infos,(long)iVar3);
        this_local._4_4_ = pvVar4->type;
      }
    }
    else if (state == 2) {
      this_local._0_4_ = 2;
    }
  }
  SVar2.data = this_local._4_4_;
  SVar2.type = (int)this_local;
  return SVar2;
}

Assistant:

SceneSignal StateScene::process(int state){
	SceneSignal signal(SS_SIGNAL_NULL, 0);
	this->state = state;
	if(state == STATE_NORMAL){

	}
	else if(state == STATE_PLANT){
		int tIdx = startIndex+selectIndex;
		if(infos[tIdx].count==0 && sunsNumber >= infos[tIdx].needSunNumber){
			signal.type = SS_SIGNAL_GEN_PLANT;
			signal.data = infos[tIdx].type;
		}
	}
	else if(state == STATE_REMOVE){
		signal.type = SS_SIGNAL_REMOVE_PLANT; 
	}
	return signal;
}